

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

void duckdb::DecimalRoundNegativePrecisionFunction<int,duckdb::NumericHelper>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  int iVar1;
  int iVar2;
  idx_t count;
  int *piVar3;
  int *piVar4;
  unsigned_long *puVar5;
  data_ptr_t pdVar6;
  ulong uVar7;
  data_ptr_t pdVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  BoundFunctionExpression *pBVar13;
  pointer pFVar14;
  const_reference pvVar15;
  pointer pEVar16;
  reference vector;
  ulong uVar17;
  idx_t iVar18;
  idx_t i_2;
  idx_t entry_idx;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  idx_t i_1;
  idx_t iVar22;
  ulong uVar23;
  UnifiedVectorFormat local_78;
  
  pBVar13 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  pFVar14 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar13->bind_info);
  pvVar15 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::get<true>(&pBVar13->children,0);
  pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar15);
  bVar9 = DecimalType::GetScale(&pEVar16->return_type);
  pvVar15 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::get<true>(&pBVar13->children,0);
  pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar15);
  bVar10 = DecimalType::GetWidth(&pEVar16->return_type);
  iVar1 = *(int *)&pFVar14[1]._vptr_FunctionData;
  if ((int)((uint)bVar9 - (uint)bVar10) < iVar1) {
    iVar2 = *(int *)(NumericHelper::POWERS_OF_TEN + (long)(int)((uint)bVar9 - iVar1) * 8);
    iVar1 = *(int *)(NumericHelper::POWERS_OF_TEN + (long)iVar1 * -8);
    iVar11 = iVar2 / 2;
    vector = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
    count = input->count;
    if (vector->vector_type == FLAT_VECTOR) {
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar8 = result->data;
      pdVar6 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      FlatVector::VerifyFlatVector(result);
      if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        for (iVar22 = 0; count != iVar22; iVar22 = iVar22 + 1) {
          iVar12 = iVar11;
          if (*(int *)(pdVar6 + iVar22 * 4) < 0) {
            iVar12 = -iVar11;
          }
          *(int *)(pdVar8 + iVar22 * 4) = ((iVar12 + *(int *)(pdVar6 + iVar22 * 4)) / iVar2) * iVar1
          ;
        }
      }
      else {
        TemplatedValidityMask<unsigned_long>::Initialize
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>);
        puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        uVar20 = 0;
        for (uVar19 = 0; uVar19 != count + 0x3f >> 6; uVar19 = uVar19 + 1) {
          if (puVar5 == (unsigned_long *)0x0) {
            uVar21 = uVar20 + 0x40;
            if (count <= uVar20 + 0x40) {
              uVar21 = count;
            }
LAB_01e312d3:
            for (; uVar17 = uVar20, uVar20 < uVar21; uVar20 = uVar20 + 1) {
              iVar12 = iVar11;
              if (*(int *)(pdVar6 + uVar20 * 4) < 0) {
                iVar12 = -iVar11;
              }
              *(int *)(pdVar8 + uVar20 * 4) =
                   ((iVar12 + *(int *)(pdVar6 + uVar20 * 4)) / iVar2) * iVar1;
            }
          }
          else {
            uVar7 = puVar5[uVar19];
            uVar21 = uVar20 + 0x40;
            if (count <= uVar20 + 0x40) {
              uVar21 = count;
            }
            if (uVar7 == 0xffffffffffffffff) goto LAB_01e312d3;
            uVar17 = uVar21;
            if (uVar7 != 0) {
              for (uVar23 = 0; uVar17 = uVar20 + uVar23, uVar20 + uVar23 < uVar21;
                  uVar23 = uVar23 + 1) {
                if ((uVar7 >> (uVar23 & 0x3f) & 1) != 0) {
                  iVar12 = iVar11;
                  if (*(int *)(pdVar6 + uVar23 * 4 + uVar20 * 4) < 0) {
                    iVar12 = -iVar11;
                  }
                  *(int *)(pdVar8 + uVar23 * 4 + uVar20 * 4) =
                       ((iVar12 + *(int *)(pdVar6 + uVar23 * 4 + uVar20 * 4)) / iVar2) * iVar1;
                }
              }
            }
          }
          uVar20 = uVar17;
        }
      }
    }
    else if (vector->vector_type == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      piVar3 = (int *)result->data;
      piVar4 = (int *)vector->data;
      puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      iVar12 = -iVar11;
      if (-1 < *piVar4) {
        iVar12 = iVar11;
      }
      *piVar3 = ((iVar12 + *piVar4) / iVar2) * iVar1;
    }
    else {
      UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
      Vector::ToUnifiedFormat(vector,count,&local_78);
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar8 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        for (iVar22 = 0; count != iVar22; iVar22 = iVar22 + 1) {
          iVar18 = iVar22;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            iVar18 = (idx_t)(local_78.sel)->sel_vector[iVar22];
          }
          iVar12 = iVar11;
          if (*(int *)(local_78.data + iVar18 * 4) < 0) {
            iVar12 = -iVar11;
          }
          *(int *)(pdVar8 + iVar22 * 4) =
               ((iVar12 + *(int *)(local_78.data + iVar18 * 4)) / iVar2) * iVar1;
        }
      }
      else {
        for (iVar22 = 0; count != iVar22; iVar22 = iVar22 + 1) {
          iVar18 = iVar22;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            iVar18 = (idx_t)(local_78.sel)->sel_vector[iVar22];
          }
          if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [iVar18 >> 6] >> (iVar18 & 0x3f) & 1) == 0) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar22);
          }
          else {
            iVar12 = iVar11;
            if (*(int *)(local_78.data + iVar18 * 4) < 0) {
              iVar12 = -iVar11;
            }
            *(int *)(pdVar8 + iVar22 * 4) =
                 ((iVar12 + *(int *)(local_78.data + iVar18 * 4)) / iVar2) * iVar1;
          }
        }
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
    }
  }
  else {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    Value::INTEGER((Value *)&local_78,0);
    Vector::SetValue(result,0,(Value *)&local_78);
    Value::~Value((Value *)&local_78);
  }
  return;
}

Assistant:

static void DecimalRoundNegativePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	auto width = DecimalType::GetWidth(func_expr.children[0]->return_type);
	if (info.target_scale <= -int32_t(width - source_scale)) {
		// scale too big for width
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		result.SetValue(0, Value::INTEGER(0));
		return;
	}
	T divide_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale + source_scale]);
	T multiply_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale]);
	T addition = divide_power_of_ten / 2;

	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / divide_power_of_ten * multiply_power_of_ten);
	});
}